

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall chrono::ChArchiveIn::in<myEmployee>(ChArchiveIn *this,ChNameValue<myEmployee> *bVal)

{
  myEmployee *_pt2Object;
  char *mname;
  char *pcVar1;
  ChNameValue<chrono::ChFunctorArchiveIn> local_40;
  undefined1 local_28 [8];
  ChFunctorArchiveInSpecific<myEmployee> specFuncA;
  ChNameValue<myEmployee> *bVal_local;
  ChArchiveIn *this_local;
  
  specFuncA.pt2Object = (myEmployee *)bVal;
  _pt2Object = ChNameValue<myEmployee>::value(bVal);
  ChFunctorArchiveInSpecific<myEmployee>::ChFunctorArchiveInSpecific
            ((ChFunctorArchiveInSpecific<myEmployee> *)local_28,_pt2Object);
  mname = ChNameValue<myEmployee>::name(bVal);
  pcVar1 = ChNameValue<myEmployee>::flags(bVal);
  ChNameValue<chrono::ChFunctorArchiveIn>::ChNameValue
            (&local_40,mname,(ChFunctorArchiveIn *)local_28,*pcVar1);
  (*(this->super_ChArchive)._vptr_ChArchive[0xc])(this,&local_40);
  ChNameValue<chrono::ChFunctorArchiveIn>::~ChNameValue(&local_40);
  ChFunctorArchiveInSpecific<myEmployee>::~ChFunctorArchiveInSpecific
            ((ChFunctorArchiveInSpecific<myEmployee> *)local_28);
  return;
}

Assistant:

void in     (ChNameValue<T> bVal) {
          ChFunctorArchiveInSpecific<T> specFuncA(&bVal.value());
          this->in(ChNameValue<ChFunctorArchiveIn>(bVal.name(), specFuncA, bVal.flags()));
      }